

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIChain.cpp
# Opt level: O2

ExchangeRequests * __thiscall
adios2::aggregator::MPIChain::IExchange
          (ExchangeRequests *__return_storage_ptr__,MPIChain *this,Buffer *buffer,int step)

{
  Comm *buffer_00;
  size_t sVar1;
  _Head_base<0UL,_adios2::format::Buffer_*,_false> _Var2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar5;
  MPIChain *this_00;
  __uniq_ptr_impl<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_> _Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  _Head_base<0UL,_adios2::format::Buffer_*,_false> local_90;
  Req receiveSizeRequest;
  size_t bufferSize;
  size_t local_78;
  Comm *local_70;
  Status local_68;
  
  iVar5 = (this->super_MPIAggregator).m_Size;
  if (iVar5 == 1) {
    helper::Comm::Req::Req(&__return_storage_ptr__->m_SendSize);
    helper::Comm::Req::Req(&__return_storage_ptr__->m_SendData);
    helper::Comm::Req::Req(&__return_storage_ptr__->m_RecvData);
  }
  else {
    _Var6._M_t.
    super__Tuple_impl<0UL,_adios2::format::Buffer_*,_std::default_delete<adios2::format::Buffer>_>.
    super__Head_base<0UL,_adios2::format::Buffer_*,_false>._M_head_impl =
         (tuple<adios2::format::Buffer_*,_std::default_delete<adios2::format::Buffer>_>)
         (tuple<adios2::format::Buffer_*,_std::default_delete<adios2::format::Buffer>_>)buffer;
    if (this->m_CurrentBufferOrder != 0) {
      _Var6._M_t.
      super__Tuple_impl<0UL,_adios2::format::Buffer_*,_std::default_delete<adios2::format::Buffer>_>
      .super__Head_base<0UL,_adios2::format::Buffer_*,_false>._M_head_impl =
           (((this->super_MPIAggregator).m_Buffers.
             super__Vector_base<std::unique_ptr<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>,_std::allocator<std::unique_ptr<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>
           ._M_t;
    }
    iVar5 = iVar5 + ~step;
    iVar4 = (this->super_MPIAggregator).m_Rank;
    local_90._M_head_impl = buffer;
    ExchangeRequests::ExchangeRequests(__return_storage_ptr__);
    if (iVar4 <= iVar5 && 0 < iVar4) {
      iVar3 = (this->super_MPIAggregator).m_Rank;
      std::__cxx11::to_string(&local_d0,step);
      std::operator+(&local_b0,", aggregation Isend size at iteration ",&local_d0);
      std::operator+(&local_f0,&local_b0,"\n");
      local_70 = &(this->super_MPIAggregator).m_Comm;
      helper::Comm::Isend<unsigned_long>
                ((Comm *)&local_68,(unsigned_long *)local_70,
                 (long)_Var6._M_t.
                       super__Tuple_impl<0UL,_adios2::format::Buffer_*,_std::default_delete<adios2::format::Buffer>_>
                       .super__Head_base<0UL,_adios2::format::Buffer_*,_false>._M_head_impl + 0x30U,
                 1,iVar3 + -1,(string *)0x0);
      helper::Comm::Req::operator=(&__return_storage_ptr__->m_SendSize,(Req *)&local_68);
      helper::Comm::Req::~Req((Req *)&local_68);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      if (*(size_t *)
           ((long)_Var6._M_t.
                  super__Tuple_impl<0UL,_adios2::format::Buffer_*,_std::default_delete<adios2::format::Buffer>_>
                  .super__Head_base<0UL,_adios2::format::Buffer_*,_false>._M_head_impl + 0x30U) != 0
         ) {
        iVar3 = (**(code **)(*(long *)_Var6._M_t.
                                      super__Tuple_impl<0UL,_adios2::format::Buffer_*,_std::default_delete<adios2::format::Buffer>_>
                                      .super__Head_base<0UL,_adios2::format::Buffer_*,_false>.
                                      _M_head_impl + 0x10))
                          (_Var6._M_t.
                           super__Tuple_impl<0UL,_adios2::format::Buffer_*,_std::default_delete<adios2::format::Buffer>_>
                           .super__Head_base<0UL,_adios2::format::Buffer_*,_false>._M_head_impl);
        local_78 = CONCAT44(extraout_var,iVar3);
        sVar1 = *(size_t *)
                 ((long)_Var6._M_t.
                        super__Tuple_impl<0UL,_adios2::format::Buffer_*,_std::default_delete<adios2::format::Buffer>_>
                        .super__Head_base<0UL,_adios2::format::Buffer_*,_false>._M_head_impl + 0x30)
        ;
        iVar3 = (this->super_MPIAggregator).m_Rank;
        std::__cxx11::to_string(&local_b0,step);
        std::operator+(&local_f0,", aggregation Isend data at iteration ",&local_b0);
        helper::Comm::Isend<char>
                  ((Comm *)&local_d0,(char *)local_70,local_78,(int)sVar1,iVar3 + -1,(string *)0x1);
        helper::Comm::Req::operator=(&__return_storage_ptr__->m_SendData,(Req *)&local_d0);
        helper::Comm::Req::~Req((Req *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
    }
    if (iVar4 < iVar5) {
      bufferSize = 0;
      iVar5 = (this->super_MPIAggregator).m_Rank;
      std::__cxx11::to_string(&local_d0,step);
      std::operator+(&local_b0,", aggregation Irecv size at iteration ",&local_d0);
      std::operator+(&local_f0,&local_b0,"\n");
      buffer_00 = &(this->super_MPIAggregator).m_Comm;
      helper::Comm::Irecv<unsigned_long>
                ((Comm *)&receiveSizeRequest,(unsigned_long *)buffer_00,(size_t)&bufferSize,1,
                 iVar5 + 1,(string *)0x0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::to_string(&local_d0,step);
      std::operator+(&local_b0,", aggregation waiting for receiver size at iteration ",&local_d0);
      std::operator+(&local_f0,&local_b0,"\n");
      helper::Comm::Req::Wait(&local_68,&receiveSizeRequest,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      sVar1 = bufferSize;
      if (this->m_CurrentBufferOrder == 0) {
        local_90._M_head_impl =
             *(Buffer **)
              &(((this->super_MPIAggregator).m_Buffers.
                 super__Vector_base<std::unique_ptr<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>,_std::allocator<std::unique_ptr<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>
               ._M_t;
      }
      std::__cxx11::to_string(&local_f0,bufferSize);
      this_00 = (MPIChain *)&stack0xffffffffffffffb0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                     "in aggregation, when resizing receiving buffer to size ",&local_f0);
      ResizeUpdateBuffer(this_00,sVar1,local_90._M_head_impl,(string *)&stack0xffffffffffffffb0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
      std::__cxx11::string::~string((string *)&local_f0);
      _Var2._M_head_impl = local_90._M_head_impl;
      if (bufferSize != 0) {
        iVar4 = (*(local_90._M_head_impl)->_vptr_Buffer[2])(local_90._M_head_impl);
        sVar1 = (_Var2._M_head_impl)->m_Position;
        iVar5 = (this->super_MPIAggregator).m_Rank;
        std::__cxx11::to_string(&local_b0,step);
        std::operator+(&local_f0,", aggregation Irecv data at iteration ",&local_b0);
        helper::Comm::Irecv<char>
                  ((Comm *)&local_d0,(char *)buffer_00,CONCAT44(extraout_var_00,iVar4),(int)sVar1,
                   iVar5 + 1,(string *)0x1);
        helper::Comm::Req::operator=(&__return_storage_ptr__->m_RecvData,(Req *)&local_d0);
        helper::Comm::Req::~Req((Req *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      helper::Comm::Req::~Req(&receiveSizeRequest);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

MPIChain::ExchangeRequests MPIChain::IExchange(format::Buffer &buffer, const int step)
{
    if (m_Size == 1)
    {
        return {};
    }

    format::Buffer &sendBuffer = GetSender(buffer);
    const int endRank = m_Size - 1 - step;
    const bool sender = (m_Rank >= 1 && m_Rank <= endRank) ? true : false;
    const bool receiver = (m_Rank < endRank) ? true : false;

    ExchangeRequests requests;

    if (sender) // sender
    {
        requests.m_SendSize =
            m_Comm.Isend(&sendBuffer.m_Position, 1, m_Rank - 1, 0,
                         ", aggregation Isend size at iteration " + std::to_string(step) + "\n");

        // only send data if buffer larger than 0
        if (sendBuffer.m_Position > 0)
        {
            requests.m_SendData =
                m_Comm.Isend(sendBuffer.Data(), sendBuffer.m_Position, m_Rank - 1, 1,
                             ", aggregation Isend data at iteration " + std::to_string(step));
        }
    }
    // receive size, resize receiving buffer and receive data
    if (receiver)
    {
        size_t bufferSize = 0;
        helper::Comm::Req receiveSizeRequest =
            m_Comm.Irecv(&bufferSize, 1, m_Rank + 1, 0,
                         ", aggregation Irecv size at iteration " + std::to_string(step) + "\n");

        receiveSizeRequest.Wait(", aggregation waiting for receiver size at iteration " +
                                std::to_string(step) + "\n");

        format::Buffer &receiveBuffer = GetReceiver(buffer);
        ResizeUpdateBuffer(bufferSize, receiveBuffer,
                           "in aggregation, when resizing receiving buffer to size " +
                               std::to_string(bufferSize));

        // only receive data if buffer is larger than 0
        if (bufferSize > 0)
        {
            requests.m_RecvData =
                m_Comm.Irecv(receiveBuffer.Data(), receiveBuffer.m_Position, m_Rank + 1, 1,
                             ", aggregation Irecv data at iteration " + std::to_string(step));
        }
    }

    return requests;
}